

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O0

int condvar_wait_time(condvar_handle *condvar,mutex_handle *mutex,uint32_t msec)

{
  pthread_cond_t *__cond;
  long lVar1;
  int local_54;
  undefined1 auStack_40 [4];
  int ret;
  timespec abstime;
  mutex_priv *mpriv;
  condvar_priv *priv;
  uint32_t msec_local;
  mutex_handle *mutex_local;
  condvar_handle *condvar_local;
  
  __cond = (pthread_cond_t *)condvar->priv;
  abstime.tv_nsec = (__syscall_slong_t)mutex->priv;
  clock_gettime(0,(timespec *)auStack_40);
  lVar1 = (ulong)((msec % 1000) * 1000000) + abstime.tv_sec;
  _auStack_40 = (ulong)msec / 1000 + lVar1 / 1000000000 + _auStack_40;
  abstime.tv_sec = lVar1 % 1000000000;
  local_54 = pthread_cond_timedwait
                       (__cond,(pthread_mutex_t *)(abstime.tv_nsec + 0x30),(timespec *)auStack_40);
  if (local_54 == 0x6e) {
    local_54 = 1;
  }
  else {
    local_54 = -local_54;
  }
  return local_54;
}

Assistant:

int condvar_wait_time(struct condvar_handle *condvar,
		      struct mutex_handle *mutex, uint32_t msec)
{
	struct condvar_priv *priv = condvar->priv;
	struct mutex_priv *mpriv = mutex->priv;
	struct timespec abstime;
	int ret;

	clock_gettime(CLOCK_REALTIME, &abstime);
	abstime.tv_nsec += (msec % 1000) * 1000000;
	abstime.tv_sec += (msec / 1000) + (abstime.tv_nsec / 1000000000);
	abstime.tv_nsec %= 1000000000;

	ret = pthread_cond_timedwait(&priv->cond, &mpriv->lock, &abstime);
	return ret == ETIMEDOUT ? 1 : -ret;
}